

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabinkarphash.h
# Opt level: O1

void __thiscall
KarpRabinHash<unsigned_int,_unsigned_char>::KarpRabinHash
          (KarpRabinHash<unsigned_int,_unsigned_char> *this,int myn,int mywordsize)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  this->hashvalue = 0;
  this->n = myn;
  this->wordsize = mywordsize;
  uVar1 = maskfnc<unsigned_int>(mywordsize);
  CharacterHash<unsigned_int,_unsigned_char>::CharacterHash(&this->hasher,uVar1);
  uVar1 = maskfnc<unsigned_int>(this->wordsize);
  this->HASHMASK = uVar1;
  this->BtoN = 1;
  iVar2 = this->n;
  if (0 < iVar2) {
    uVar3 = 1;
    do {
      uVar3 = uVar3 * 0x25 & uVar1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    this->BtoN = uVar3;
  }
  return;
}

Assistant:

KarpRabinHash(int myn, int mywordsize = 19)
      : hashvalue(0), n(myn), wordsize(mywordsize),
        hasher(maskfnc<hashvaluetype>(wordsize)),
        HASHMASK(maskfnc<hashvaluetype>(wordsize)), BtoN(1) {
    for (int i = 0; i < n; ++i) {
      BtoN *= B;
      BtoN &= HASHMASK;
    }
  }